

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O2

ULONG __thiscall
Js::StackTraceHelper::GetStackTrace
          (StackTraceHelper *this,ULONG framesToSkip,ULONG framesToCapture,void **stackFrames)

{
  StackBackTrace SVar1;
  code *pcVar2;
  bool bVar3;
  ULONG UVar4;
  StackBackTrace *this_00;
  undefined4 *puVar5;
  ulong uVar6;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType autoNestedHandledExceptionType;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_DisableCheck);
  this_00 = GetStackBackTrace(this,framesToCapture);
  UVar4 = StackBackTrace::Capture(this_00,framesToSkip);
  if (framesToCapture < UVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MemoryLogger.cpp"
                                ,0x44,"(capturedCount <= framesToCapture)",
                                "capturedCount <= framesToCapture");
    if (!bVar3) {
LAB_006670ba:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  uVar6 = 0;
  do {
    if (this_00->framesCount <= uVar6) {
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
      return UVar4;
    }
    SVar1 = this_00[uVar6 + 1];
    if (framesToCapture < uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MemoryLogger.cpp"
                                  ,0x47,"(i <= framesToCapture)","i <= framesToCapture");
      if (!bVar3) goto LAB_006670ba;
      *puVar5 = 0;
    }
    *(StackBackTrace *)(stackFrames + uVar6) = SVar1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

ULONG StackTraceHelper::GetStackTrace(ULONG framesToSkip, ULONG framesToCapture, void** stackFrames)
    {
#ifdef EXCEPTION_CHECK
        AutoNestedHandledExceptionType autoNestedHandledExceptionType(ExceptionType_DisableCheck);
#endif
        StackBackTrace* stackTrace = this->GetStackBackTrace(framesToCapture);
        ULONG capturedCount = stackTrace->Capture(framesToSkip);
        Assert(capturedCount <= framesToCapture);
        ULONG i = 0;
        stackTrace->Map([&i, framesToCapture, stackFrames](void* funcAddr){
            Assert(i <= framesToCapture);
            stackFrames[i++] = funcAddr;
        });
        return capturedCount;
    }